

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symmetric_difference_iterator.hpp
# Opt level: O3

void __thiscall
burst::
symmetric_difference_iterator<__gnu_cxx::__normal_iterator<boost::integer_range<int>_*,_std::vector<boost::integer_range<int>,_std::allocator<boost::integer_range<int>_>_>_>,_std::less<void>_>
::maintain_invariant
          (symmetric_difference_iterator<__gnu_cxx::__normal_iterator<boost::integer_range<int>_*,_std::vector<boost::integer_range<int>,_std::allocator<boost::integer_range<int>_>_>_>,_std::less<void>_>
           *this)

{
  integer_range<int> *piVar1;
  __normal_iterator<boost::integer_range<int>_*,_std::vector<boost::integer_range<int>,_std::allocator<boost::integer_range<int>_>_>_>
  _Var2;
  __normal_iterator<boost::integer_range<int>_*,_std::vector<boost::integer_range<int>,_std::allocator<boost::integer_range<int>_>_>_>
  last;
  integer_range<int> *piVar3;
  undefined8 unaff_RBX;
  
  _Var2._M_current = (this->m_begin)._M_current;
  last._M_current = (this->m_end)._M_current;
  while( true ) {
    _Var2 = select_min<__gnu_cxx::__normal_iterator<boost::integer_range<int>*,std::vector<boost::integer_range<int>,std::allocator<boost::integer_range<int>>>>,burst::compose_fn<burst::apply_fn<std::less<void>>,burst::compose_fn<burst::by_all_fn<burst::front_t>,burst::forward_as_tuple_fn>>>
                      (_Var2,last,SUB83(unaff_RBX,0));
    (this->m_min_end)._M_current = _Var2._M_current;
    piVar1 = (this->m_begin)._M_current;
    if ((_Var2._M_current == piVar1) ||
       (piVar3 = piVar1, ((int)_Var2._M_current - (int)piVar1 & 8U) != 0)) break;
    do {
      (piVar3->super_iterator_range<boost::range_detail::integer_iterator<int>_>).
      super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::random_access_traversal_tag>
      .
      super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
      .
      super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
      .m_Begin.m_value =
           (piVar3->super_iterator_range<boost::range_detail::integer_iterator<int>_>).
           super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::random_access_traversal_tag>
           .
           super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
           .
           super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
           .m_Begin.m_value + 1;
      piVar3 = piVar3 + 1;
    } while (piVar3 != _Var2._M_current);
    last = std::
           __remove_if<__gnu_cxx::__normal_iterator<boost::integer_range<int>*,std::vector<boost::integer_range<int>,std::allocator<boost::integer_range<int>>>>,__gnu_cxx::__ops::_Iter_pred<burst::symmetric_difference_iterator<__gnu_cxx::__normal_iterator<boost::integer_range<int>*,std::vector<boost::integer_range<int>,std::allocator<boost::integer_range<int>>>>,std::less<void>>::remove_empty_ranges()::_lambda(auto:1_const&)_1_>>
                     (piVar1,(this->m_end)._M_current);
    (this->m_end)._M_current = last._M_current;
    _Var2._M_current = (this->m_begin)._M_current;
  }
  return;
}

Assistant:

void maintain_invariant ()
        {
            m_min_end = select_min(m_begin, m_end, each(front) | m_compare);
            while (m_min_end != m_begin && std::distance(m_begin, m_min_end) % 2 == 0)
            {
                std::for_each(m_begin, m_min_end, [] (auto & r) {r.advance_begin(1);});
                remove_empty_ranges();
                m_min_end = select_min(m_begin, m_end, each(front) | m_compare);
            }
        }